

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O3

Vec_Int_t * Pdr_ManDeriveFlopPriorities3(Gia_Man_t *p,int fMuxCtrls)

{
  Gia_Obj_t *pGVar1;
  uint *puVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  long lVar10;
  void *pvVar11;
  void *pvVar12;
  Gia_Obj_t *pGVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  size_t __size;
  Gia_Obj_t *pGVar20;
  ulong uVar21;
  long lVar22;
  Gia_Obj_t *pData0;
  Gia_Obj_t *pData1;
  Gia_Obj_t *local_48;
  Gia_Obj_t *local_40;
  Vec_Int_t *local_38;
  
  Gia_ManCreateRefs(p);
  iVar5 = p->nRegs;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar15 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar15 = iVar5;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar15;
  if (iVar15 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar15 << 2);
  }
  pVVar8->pArray = piVar9;
  if (iVar5 < 1) {
    uVar14 = 1;
  }
  else {
    iVar18 = 0;
    iVar15 = 0;
    do {
      iVar3 = p->vCis->nSize;
      uVar14 = (iVar3 - iVar5) + iVar18;
      if (((int)uVar14 < 0) || (iVar3 <= (int)uVar14)) goto LAB_005f3733;
      iVar3 = p->vCis->pArray[uVar14];
      lVar10 = (long)iVar3;
      if ((lVar10 < 0) || (p->nObjs <= iVar3)) goto LAB_005f36d6;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar20 = p->pObjs + lVar10;
      Vec_IntPush(pVVar8,p->pRefs[lVar10]);
      pGVar13 = p->pObjs;
      if ((pGVar20 < pGVar13) || (pGVar13 + p->nObjs <= pGVar20)) goto LAB_005f36f5;
      if (iVar15 <= p->pRefs[(int)((ulong)((long)pGVar20 - (long)pGVar13) >> 2) * -0x55555555]) {
        iVar15 = p->pRefs[(int)((ulong)((long)pGVar20 - (long)pGVar13) >> 2) * -0x55555555];
      }
      iVar18 = iVar18 + 1;
      iVar5 = p->nRegs;
    } while (iVar18 < iVar5);
    uVar14 = iVar15 + 1;
  }
  if (fMuxCtrls != 0) {
    uVar6 = p->nObjs;
    uVar21 = (ulong)uVar6;
    iVar15 = (((int)uVar6 >> 5) + 1) - (uint)((uVar6 & 0x1f) == 0);
    if (iVar15 == 0) {
      pvVar11 = (void *)0x0;
      __size = 0;
      pvVar12 = (void *)0x0;
    }
    else {
      __size = (long)iVar15 << 2;
      pvVar11 = calloc(1,__size);
      pvVar12 = malloc(__size);
    }
    uVar16 = iVar15 * 0x20;
    memset(pvVar12,0,__size);
    if (0 < (int)uVar6) {
      lVar10 = 0;
      lVar22 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar20 = (Gia_Obj_t *)(&p->pObjs->field_0x0 + lVar10);
        if ((~*(uint *)pGVar20 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar20) {
          iVar5 = Gia_ObjIsMuxType(pGVar20);
          if (iVar5 == 0) {
            uVar21 = (ulong)(uint)p->nObjs;
          }
          else {
            pGVar13 = Gia_ObjRecognizeMux(pGVar20,&local_40,&local_48);
            pGVar13 = (Gia_Obj_t *)((ulong)pGVar13 & 0xfffffffffffffffe);
            local_40 = (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe);
            local_48 = (Gia_Obj_t *)((ulong)local_48 & 0xfffffffffffffffe);
            pGVar20 = p->pObjs;
            if (pGVar13 < pGVar20) {
LAB_005f36f5:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar21 = (ulong)p->nObjs;
            pGVar1 = pGVar20 + uVar21;
            if (pGVar1 <= pGVar13) goto LAB_005f36f5;
            lVar17 = ((long)pGVar13 - (long)pGVar20 >> 2) * -0x5555555555555555;
            uVar6 = (uint)lVar17;
            if (((int)uVar6 < 0) || ((int)uVar16 <= (int)uVar6)) {
LAB_005f3771:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                            ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
            }
            puVar2 = (uint *)((long)pvVar11 + (ulong)(uVar6 >> 3 & 0xffffffc));
            *puVar2 = *puVar2 | 1 << ((byte)lVar17 & 0x1f);
            if ((local_40 < pGVar20) || (pGVar1 <= local_40)) goto LAB_005f36f5;
            lVar17 = ((long)local_40 - (long)pGVar20 >> 2) * -0x5555555555555555;
            uVar6 = (uint)lVar17;
            if (((int)uVar6 < 0) || (uVar16 <= uVar6)) goto LAB_005f3771;
            puVar2 = (uint *)((long)pvVar12 + (ulong)(uVar6 >> 3 & 0xffffffc));
            *puVar2 = *puVar2 | 1 << ((byte)lVar17 & 0x1f);
            if ((local_48 < pGVar20) || (pGVar1 <= local_48)) goto LAB_005f36f5;
            lVar17 = ((long)local_48 - (long)pGVar20 >> 2) * -0x5555555555555555;
            uVar6 = (uint)lVar17;
            if (((int)uVar6 < 0) || (uVar16 <= uVar6)) goto LAB_005f3771;
            puVar2 = (uint *)((long)pvVar12 + (ulong)(uVar6 >> 3 & 0xffffffc));
            *puVar2 = *puVar2 | 1 << ((byte)lVar17 & 0x1f);
          }
        }
        lVar22 = lVar22 + 1;
        lVar10 = lVar10 + 0xc;
      } while (lVar22 < (int)uVar21);
      iVar5 = p->nRegs;
    }
    if (iVar5 < 1) {
LAB_005f3451:
      uVar14 = uVar14 * 2 + 1;
      if (pvVar11 != (void *)0x0) goto LAB_005f345d;
    }
    else {
      pVVar4 = p->vCis;
      lVar10 = 0;
      do {
        iVar15 = pVVar4->nSize;
        uVar21 = (ulong)(uint)(iVar15 - iVar5) + lVar10;
        iVar18 = (int)uVar21;
        if ((iVar18 < 0) || (iVar15 <= iVar18)) {
LAB_005f3733:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar6 = pVVar4->pArray[uVar21 & 0xffffffff];
        if (((int)uVar6 < 0) || (p->nObjs <= (int)uVar6)) {
LAB_005f36d6:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_005f3451;
        if ((int)uVar16 <= (int)uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if ((*(uint *)((long)pvVar11 + (ulong)(uVar6 >> 5) * 4) >> (uVar6 & 0x1f) & 1) != 0) {
          if (pVVar8->nSize <= lVar10) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          pVVar8->pArray[lVar10] = pVVar8->pArray[lVar10] + uVar14;
          iVar5 = p->nRegs;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar5);
      uVar14 = uVar14 * 2 + 1;
LAB_005f345d:
      free(pvVar11);
    }
    if (pvVar12 != (void *)0x0) {
      free(pvVar12);
    }
  }
  uVar6 = 8;
  if (6 < uVar14 - 1) {
    uVar6 = uVar14;
  }
  pvVar11 = calloc((long)(int)uVar6,0x10);
  iVar15 = pVVar8->nSize;
  local_38 = pVVar8;
  if (0 < (long)iVar15) {
    piVar9 = pVVar8->pArray;
    lVar10 = 0;
    do {
      uVar16 = piVar9[lVar10];
      if ((int)uVar14 <= (int)uVar16) {
        uVar19 = uVar16 + 1;
        uVar7 = uVar14 * 2;
        if ((int)(uVar14 * 2) <= (int)uVar19) {
          uVar7 = uVar19;
        }
        uVar14 = uVar19;
        if (uVar7 - uVar6 != 0 && (int)uVar6 <= (int)uVar7) {
          if (pvVar11 == (void *)0x0) {
            pvVar11 = malloc((long)(int)uVar7 << 4);
          }
          else {
            pvVar11 = realloc(pvVar11,(long)(int)uVar7 << 4);
          }
          memset((void *)((long)(int)uVar6 * 0x10 + (long)pvVar11),0,(long)(int)(uVar7 - uVar6) << 4
                );
          uVar6 = uVar7;
        }
      }
      if (((int)uVar16 < 0) || ((int)uVar14 <= (int)uVar16)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush((Vec_Int_t *)((ulong)uVar16 * 0x10 + (long)pvVar11),(int)lVar10);
      lVar10 = lVar10 + 1;
    } while (iVar15 != lVar10);
    iVar5 = p->nRegs;
  }
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar15 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar15 = iVar5;
  }
  pVVar8->nCap = iVar15;
  if (iVar15 == 0) {
    pVVar8->pArray = (int *)0x0;
    pVVar8->nSize = iVar5;
LAB_005f35bc:
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar15 << 2);
    pVVar8->pArray = piVar9;
    pVVar8->nSize = iVar5;
    if (piVar9 == (int *)0x0) goto LAB_005f35bc;
    memset(piVar9,0,(long)iVar5 << 2);
  }
  if ((int)uVar14 < 1) {
    iVar15 = 0;
  }
  else {
    uVar21 = 0;
    iVar15 = 0;
    do {
      lVar10 = uVar21 * 0x10;
      if (0 < *(int *)((long)pvVar11 + lVar10 + 4)) {
        lVar22 = *(long *)((long)pvVar11 + lVar10 + 8);
        lVar17 = 0;
        do {
          iVar18 = *(int *)(lVar22 + lVar17 * 4);
          if (((long)iVar18 < 0) || (iVar5 <= iVar18)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar9[iVar18] = iVar15 + (int)lVar17;
          lVar17 = lVar17 + 1;
        } while (lVar17 < *(int *)((long)pvVar11 + lVar10 + 4));
        iVar15 = iVar15 + (int)lVar17;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar14);
  }
  if (iVar15 != iVar5) {
    __assert_fail("MaxEntry == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrMan.c"
                  ,0x86,"Vec_Int_t *Pdr_ManDeriveFlopPriorities3(Gia_Man_t *, int)");
  }
  if ((int)uVar6 < 1) {
    if (pvVar11 == (void *)0x0) goto LAB_005f366c;
  }
  else {
    lVar10 = 0;
    do {
      pvVar12 = *(void **)((long)pvVar11 + lVar10 + 8);
      if (pvVar12 != (void *)0x0) {
        free(pvVar12);
        *(undefined8 *)((long)pvVar11 + lVar10 + 8) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((ulong)uVar6 << 4 != lVar10);
  }
  free(pvVar11);
LAB_005f366c:
  pVVar4 = local_38;
  if (local_38->pArray != (int *)0x0) {
    free(local_38->pArray);
  }
  free(pVVar4);
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  return pVVar8;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Structural analysis.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Pdr_ManDeriveFlopPriorities3( Gia_Man_t * p, int fMuxCtrls )
{
    int fDiscount = 0;
    Vec_Wec_t * vLevels;
    Vec_Int_t * vRes, * vLevel, * vCosts;
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1; 
    int i, k, Entry, MaxEntry = 0;
    Gia_ManCreateRefs(p);
    // discount references
    if ( fDiscount )
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjIsMuxType(pObj) )
                continue;
            pCtrl  = Gia_Regular(Gia_ObjRecognizeMux(pObj, &pData1, &pData0));
            pData0 = Gia_Regular(pData0);
            pData1 = Gia_Regular(pData1);
            p->pRefs[Gia_ObjId(p, pCtrl)]--;
            if ( pData0 == pData1 )
                p->pRefs[Gia_ObjId(p, pData0)]--;
        }
    }
    // create flop costs
    vCosts = Vec_IntAlloc( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, i )
    {
        Vec_IntPush( vCosts, Gia_ObjRefNum(p, pObj) );
        MaxEntry = Abc_MaxInt( MaxEntry, Gia_ObjRefNum(p, pObj) );
        //printf( "%d(%d) ", i, Gia_ObjRefNum(p, pObj) );
    }
    //printf( "\n" );
    MaxEntry++;
    // add costs due to MUX inputs
    if ( fMuxCtrls )
    {
        int fVerbose = 0;
        Vec_Bit_t * vCtrls = Vec_BitStart( Gia_ManObjNum(p) );
        Vec_Bit_t * vDatas = Vec_BitStart( Gia_ManObjNum(p) );
        Gia_Obj_t * pCtrl, * pData1, * pData0; 
        int nCtrls = 0, nDatas = 0, nBoth = 0;
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjIsMuxType(pObj) )
                continue;
            pCtrl  = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
            pCtrl  = Gia_Regular(pCtrl);
            pData1 = Gia_Regular(pData1);
            pData0 = Gia_Regular(pData0);
            Vec_BitWriteEntry( vCtrls, Gia_ObjId(p, pCtrl), 1 );
            Vec_BitWriteEntry( vDatas, Gia_ObjId(p, pData1), 1 );
            Vec_BitWriteEntry( vDatas, Gia_ObjId(p, pData0), 1 );
        }
        Gia_ManForEachRo( p, pObj, i )
            if ( Vec_BitEntry(vCtrls, Gia_ObjId(p, pObj)) )
                Vec_IntAddToEntry( vCosts, i, MaxEntry );
            //else if ( Vec_BitEntry(vDatas, Gia_ObjId(p, pObj)) )
            //    Vec_IntAddToEntry( vCosts, i,   MaxEntry );
        MaxEntry = 2*MaxEntry + 1;
        // print out
        if ( fVerbose )
        {
            Gia_ManForEachRo( p, pObj, i )
            {
                if ( Vec_BitEntry(vCtrls, Gia_ObjId(p, pObj)) )
                    nCtrls++;
                if ( Vec_BitEntry(vDatas, Gia_ObjId(p, pObj)) )
                    nDatas++;
                if ( Vec_BitEntry(vCtrls, Gia_ObjId(p, pObj)) && Vec_BitEntry(vDatas, Gia_ObjId(p, pObj)) )
                    nBoth++;
            }
            printf( "%10s : Flops = %5d.  Ctrls = %5d.  Datas = %5d.  Both = %5d.\n", Gia_ManName(p), Gia_ManRegNum(p), nCtrls, nDatas, nBoth );
        }
        Vec_BitFree( vCtrls );
        Vec_BitFree( vDatas );
    }
    // create levelized structure
    vLevels = Vec_WecStart( MaxEntry );
    Vec_IntForEachEntry( vCosts, Entry, i )
        Vec_WecPush( vLevels, Entry, i );
    // collect in this order
    MaxEntry = 0;
    vRes = Vec_IntStart( Gia_ManRegNum(p) );
    Vec_WecForEachLevel( vLevels, vLevel, i )
        Vec_IntForEachEntry( vLevel, Entry, k )
            Vec_IntWriteEntry( vRes, Entry, MaxEntry++ );
        //printf( "%d ", Gia_ObjRefNum(p, Gia_ManCi(p, Gia_ManPiNum(p)+Entry)) );
    //printf( "\n" );
    assert( MaxEntry == Gia_ManRegNum(p) );
    Vec_WecFree( vLevels );
    Vec_IntFree( vCosts );
    ABC_FREE( p->pRefs );
//Vec_IntPrint( vRes );
    return vRes;
}